

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzer.cpp
# Opt level: O1

bool __thiscall
SpiAnalyzer::WouldAdvancingTheClockToggleEnable
          (SpiAnalyzer *this,bool add_disable_frame,U64 *disable_frame)

{
  char cVar1;
  BitState BVar2;
  ulonglong uVar3;
  FrameV2 frame_v2_end_of_transaction;
  FrameV2 local_30 [8];
  
  if (this->mEnable == (AnalyzerChannelData *)0x0) {
    return false;
  }
  cVar1 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
  if (((cVar1 == '\0') &&
      (BVar2 = AnalyzerChannelData::GetBitState(),
      BVar2 == ((this->mSettings)._M_ptr)->mEnableActiveState)) &&
     (cVar1 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData(), cVar1 != '\0')) {
    uVar3 = AnalyzerChannelData::GetSampleOfNextEdge();
    cVar1 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition((ulonglong)this->mClock)
    ;
    if (cVar1 == '\0') {
      if (add_disable_frame) {
        FrameV2::FrameV2(local_30);
        AnalyzerResults::AddFrameV2
                  ((FrameV2 *)(this->mResults)._M_ptr,(char *)local_30,0x10901e,uVar3);
        FrameV2::~FrameV2(local_30);
        return true;
      }
      cVar1 = '\x01';
      goto LAB_0010681f;
    }
  }
  AnalyzerChannelData::GetSampleOfNextEdge();
  cVar1 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition((ulonglong)this->mEnable);
  if (cVar1 == '\0') {
    return false;
  }
  uVar3 = AnalyzerChannelData::GetSampleOfNextEdge();
  if (add_disable_frame) {
    FrameV2::FrameV2(local_30);
    AnalyzerResults::AddFrameV2((FrameV2 *)(this->mResults)._M_ptr,(char *)local_30,0x10901e,uVar3);
    FrameV2::~FrameV2(local_30);
    return (bool)cVar1;
  }
LAB_0010681f:
  if (disable_frame != (U64 *)0x0) {
    *disable_frame = uVar3;
  }
  return (bool)cVar1;
}

Assistant:

bool SpiAnalyzer::WouldAdvancingTheClockToggleEnable( bool add_disable_frame, U64* disable_frame )
{
    if( mEnable == NULL )
        return false;

    auto log_disable_event = [&]( U64 enable_edge ) {
        if( add_disable_frame )
        {
            FrameV2 frame_v2_end_of_transaction;
            mResults->AddFrameV2( frame_v2_end_of_transaction, "disable", enable_edge, enable_edge + 1 );
        }
        else if( disable_frame != nullptr )
        {
            *disable_frame = enable_edge;
        }
    };

    // if the enable is currently active, and there are no more clock transitions in the capture, attempt to capture the final disable event
    if( !mClock->DoMoreTransitionsExistInCurrentData() && mEnable->GetBitState() == mSettings->mEnableActiveState )
    {
        if( mEnable->DoMoreTransitionsExistInCurrentData() )
        {
            U64 next_enable_edge = mEnable->GetSampleOfNextEdge();
            // double check that the clock line actually processed all samples up to the next enable edge.
            // double check is required becase data is getting processed while we're running, it's possible more has already become
            // available.
            if( !mClock->WouldAdvancingToAbsPositionCauseTransition( next_enable_edge ) )
            {
                log_disable_event( next_enable_edge );
                return true;
            }
        }
    }

    U64 next_edge = mClock->GetSampleOfNextEdge();
    bool enable_will_toggle = mEnable->WouldAdvancingToAbsPositionCauseTransition( next_edge );

    if( enable_will_toggle )
    {
        U64 enable_edge = mEnable->GetSampleOfNextEdge();
        log_disable_event( enable_edge );
    }

    if( enable_will_toggle == false )
        return false;
    else
        return true;
}